

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *this,string *name)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Program *this_00;
  SharedPtrStateBase *pSVar3;
  mapped_type *pmVar4;
  
  this_00 = (Program *)operator_new(0x50);
  Program::Program(this_00);
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2bac8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
           ::operator[](&this->m_objects,name);
  pSVar2 = pmVar4->m_state;
  if (pSVar2 != pSVar3) {
    if (pSVar2 == (SharedPtrStateBase *)0x0) {
      pmVar4->m_ptr = this_00;
      pmVar4->m_state = pSVar3;
    }
    else {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pmVar4->m_ptr = (Program *)0x0;
        (*pmVar4->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &pmVar4->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (pmVar4->m_state != (SharedPtrStateBase *)0x0) {
          (*pmVar4->m_state->_vptr_SharedPtrStateBase[1])();
        }
        pmVar4->m_state = (SharedPtrStateBase *)0x0;
      }
      pmVar4->m_ptr = this_00;
      pmVar4->m_state = pSVar3;
      if (pSVar3 == (SharedPtrStateBase *)0x0) {
        return;
      }
    }
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &pmVar4->m_state->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    if (pSVar3 == (SharedPtrStateBase *)0x0) {
      return;
    }
  }
  LOCK();
  pdVar1 = &pSVar3->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar3->_vptr_SharedPtrStateBase[2])(pSVar3);
  }
  LOCK();
  pdVar1 = &pSVar3->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if ((*pdVar1 == 0) && (pSVar3 != (SharedPtrStateBase *)0x0)) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
    return;
  }
  return;
}

Assistant:

void						make						(const string& name)								{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T); }